

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O2

void transpose_16bit_4x8(__m128i *in,__m128i *out)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  longlong lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  alVar1 = *in;
  alVar2 = in[2];
  alVar3 = in[4];
  alVar4 = in[6];
  auVar13._0_12_ = alVar1._0_12_;
  auVar13._12_2_ = alVar1[0]._6_2_;
  auVar13._14_2_ = *(undefined2 *)((long)in[1] + 6);
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._0_10_ = alVar1._0_10_;
  auVar12._10_2_ = *(undefined2 *)((long)in[1] + 4);
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._0_8_ = alVar1[0];
  auVar11._8_2_ = alVar1[0]._4_2_;
  auVar5._4_8_ = auVar11._8_8_;
  auVar5._2_2_ = *(undefined2 *)((long)in[1] + 2);
  auVar5._0_2_ = alVar1[0]._2_2_;
  auVar10._0_4_ = CONCAT22((short)in[1][0],(short)alVar1[0]);
  auVar10._4_12_ = auVar5;
  auVar16._0_12_ = alVar2._0_12_;
  auVar16._12_2_ = alVar2[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)in[3] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar2._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)in[3] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar2[0];
  auVar14._8_2_ = alVar2[0]._4_2_;
  auVar6._4_8_ = auVar14._8_8_;
  auVar6._2_2_ = *(undefined2 *)((long)in[3] + 2);
  auVar6._0_2_ = alVar2[0]._2_2_;
  auVar20._0_12_ = alVar3._0_12_;
  auVar20._12_2_ = alVar3[0]._6_2_;
  auVar20._14_2_ = *(undefined2 *)((long)in[5] + 6);
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = alVar3._0_10_;
  auVar19._10_2_ = *(undefined2 *)((long)in[5] + 4);
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = alVar3[0];
  auVar18._8_2_ = alVar3[0]._4_2_;
  auVar7._4_8_ = auVar18._8_8_;
  auVar7._2_2_ = *(undefined2 *)((long)in[5] + 2);
  auVar7._0_2_ = alVar3[0]._2_2_;
  auVar17._0_4_ = CONCAT22((short)in[5][0],(short)alVar3[0]);
  auVar17._4_12_ = auVar7;
  lVar9 = in[7][0];
  auVar23._0_12_ = alVar4._0_12_;
  auVar23._12_2_ = alVar4[0]._6_2_;
  auVar23._14_2_ = *(undefined2 *)((long)in[7] + 6);
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = alVar4._0_10_;
  auVar22._10_2_ = *(undefined2 *)((long)in[7] + 4);
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = alVar4[0];
  auVar21._8_2_ = alVar4[0]._4_2_;
  auVar8._4_8_ = auVar21._8_8_;
  auVar8._2_2_ = *(undefined2 *)((long)in[7] + 2);
  auVar8._0_2_ = alVar4[0]._2_2_;
  auVar24._0_8_ = auVar10._0_8_;
  auVar24._8_4_ = auVar5._0_4_;
  auVar24._12_4_ = auVar6._0_4_;
  auVar25._0_8_ = auVar17._0_8_;
  auVar25._8_4_ = auVar7._0_4_;
  auVar25._12_4_ = auVar8._0_4_;
  (*out)[0] = CONCAT44(CONCAT22((short)in[3][0],(short)alVar2[0]),auVar10._0_4_);
  (*out)[1] = CONCAT44(CONCAT22((short)lVar9,(short)alVar4[0]),auVar17._0_4_);
  out[1][0] = auVar24._8_8_;
  out[1][1] = auVar25._8_8_;
  *(int *)out[2] = auVar11._8_4_;
  *(int *)((long)out[2] + 4) = auVar14._8_4_;
  *(int *)(out[2] + 1) = auVar18._8_4_;
  *(int *)((long)out[2] + 0xc) = auVar21._8_4_;
  *(undefined4 *)(out[3] + 1) = auVar12._12_4_;
  *(undefined4 *)((long)out[3] + 0xc) = auVar15._12_4_;
  *(undefined4 *)out[4] = auVar19._12_4_;
  *(undefined4 *)((long)out[4] + 4) = auVar22._12_4_;
  return;
}

Assistant:

static inline void transpose_16bit_4x8(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  XX XX XX XX
  // in[1]: 10 11 12 13  XX XX XX XX
  // in[2]: 20 21 22 23  XX XX XX XX
  // in[3]: 30 31 32 33  XX XX XX XX
  // in[4]: 40 41 42 43  XX XX XX XX
  // in[5]: 50 51 52 53  XX XX XX XX
  // in[6]: 60 61 62 63  XX XX XX XX
  // in[7]: 70 71 72 73  XX XX XX XX
  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a2:    40 50 41 51  42 52 43 53
  // a3:    60 70 61 71  62 72 63 73
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a2 = _mm_unpacklo_epi16(in[4], in[5]);
  const __m128i a3 = _mm_unpacklo_epi16(in[6], in[7]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b1: 40 50 60 70  41 51 61 71
  // b2: 02 12 22 32  03 13 23 33
  // b3: 42 52 62 72  43 53 63 73
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b1 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b2 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b3 = _mm_unpackhi_epi32(a2, a3);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  40 50 60 70
  // out[1]: 01 11 21 31  41 51 61 71
  // out[2]: 02 12 22 32  42 52 62 72
  // out[3]: 03 13 23 33  43 53 63 73
  out[0] = _mm_unpacklo_epi64(b0, b1);
  out[1] = _mm_unpackhi_epi64(b0, b1);
  out[2] = _mm_unpacklo_epi64(b2, b3);
  out[3] = _mm_unpackhi_epi64(b2, b3);
}